

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool Grammar::is_integer_value(string *str)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  if (str->_M_string_length == 0) {
    return false;
  }
  bVar3 = str_utils::is_numeric(*(str->_M_dataplus)._M_p);
  if (((bVar3) || (cVar1 = *(str->_M_dataplus)._M_p, cVar1 == '-')) || (cVar1 == '+')) {
    iVar2 = (int)str->_M_string_length;
    bVar3 = 1 < iVar2;
    if (1 < iVar2) {
      bVar4 = str_utils::is_numeric((str->_M_dataplus)._M_p[1]);
      if (bVar4) {
        lVar6 = 2;
        do {
          lVar5 = (long)(int)str->_M_string_length;
          bVar3 = lVar6 < lVar5;
          if (lVar5 <= lVar6) goto LAB_00140b30;
          bVar4 = str_utils::is_numeric((str->_M_dataplus)._M_p[lVar6]);
          lVar6 = lVar6 + 1;
        } while (bVar4);
      }
      if (bVar3) goto LAB_00140b2c;
    }
LAB_00140b30:
    bVar3 = str_utils::is_numeric(*(str->_M_dataplus)._M_p);
    bVar4 = true;
    if (!bVar3) {
      bVar4 = 1 < str->_M_string_length;
    }
  }
  else {
LAB_00140b2c:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Grammar::is_integer_value(const std::string& str) {
    if (str.size() == 0)
        return false;
    if (!str_utils::is_numeric(str[0]) && str[0] != '+' && str[0] != '-')
        return false;
    for (int i = 1; i < int(str.size()); i++)
        if (!str_utils::is_numeric(str[i]))
            return false;
    return str_utils::is_numeric(str[0]) || str.size() > 1;
}